

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::EdgeSensitivePathSuffixSyntax::EdgeSensitivePathSuffixSyntax
          (EdgeSensitivePathSuffixSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *outputs,Token polarityOperator,Token colon
          ,ExpressionSyntax *expr,Token closeParen)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = polarityOperator._0_8_;
  uVar5 = openParen._0_8_;
  (this->super_PathSuffixSyntax).super_SyntaxNode.kind = EdgeSensitivePathSuffix;
  (this->super_PathSuffixSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PathSuffixSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(outputs->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (outputs->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.kind =
       (outputs->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->outputs).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (outputs->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->outputs).super_SyntaxListBase.childCount = (outputs->super_SyntaxListBase).childCount;
  (this->outputs).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623b28;
  sVar2 = (outputs->elements)._M_extent._M_extent_value;
  (this->outputs).elements._M_ptr = (outputs->elements)._M_ptr;
  (this->outputs).elements._M_extent._M_extent_value = sVar2;
  (this->polarityOperator).kind = (short)uVar6;
  (this->polarityOperator).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->polarityOperator).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->polarityOperator).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->polarityOperator).info = polarityOperator.info;
  (this->colon).kind = colon.kind;
  (this->colon).field_0x2 = colon._2_1_;
  (this->colon).numFlags = (NumericTokenFlags)colon.numFlags.raw;
  (this->colon).rawLen = colon.rawLen;
  (this->colon).info = colon.info;
  (this->expr).ptr = expr;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->outputs).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->outputs).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar4)->parent = (SyntaxNode *)this;
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    expr = (this->expr).ptr;
  }
  (expr->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

EdgeSensitivePathSuffixSyntax(Token openParen, const SeparatedSyntaxList<NameSyntax>& outputs, Token polarityOperator, Token colon, ExpressionSyntax& expr, Token closeParen) :
        PathSuffixSyntax(SyntaxKind::EdgeSensitivePathSuffix), openParen(openParen), outputs(outputs), polarityOperator(polarityOperator), colon(colon), expr(&expr), closeParen(closeParen) {
        this->outputs.parent = this;
        for (auto child : this->outputs)
            child->parent = this;
        this->expr->parent = this;
    }